

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O1

void __thiscall CUI::Update(CUI *this,float MouseX,float MouseY,float MouseWorldX,float MouseWorldY)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  uint uVar4;
  
  uVar1 = 0;
  if (this->m_Enabled == true) {
    uVar1 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x19b);
    iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x19c);
    uVar4 = (uVar1 & 0xff) + 2;
    if ((char)iVar2 == '\0') {
      uVar4 = uVar1 & 0xff;
    }
    iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x19d);
    uVar1 = uVar4 + 4;
    if ((char)iVar2 == '\0') {
      uVar1 = uVar4;
    }
  }
  this->m_MouseX = MouseX;
  this->m_MouseY = MouseY;
  this->m_MouseWorldX = MouseWorldX;
  this->m_MouseWorldY = MouseWorldY;
  this->m_LastMouseButtons = this->m_MouseButtons;
  this->m_MouseButtons = uVar1;
  pvVar3 = this->m_pActiveItem;
  if (pvVar3 == (void *)0x0) {
    pvVar3 = this->m_pBecommingHotItem;
  }
  this->m_pHotItem = pvVar3;
  this->m_pBecommingHotItem = (void *)0x0;
  if (((this->m_Enabled == true) && (CLineInput::s_pActiveInput != (CLineInput *)0x0)) &&
     (CLineInput::s_pActiveInput != (CLineInput *)this->m_pLastActiveItem &&
      (CLineInput *)this->m_pLastActiveItem != (CLineInput *)0x0)) {
    CLineInput::Deactivate(CLineInput::s_pActiveInput);
    return;
  }
  return;
}

Assistant:

void CUI::Update(float MouseX, float MouseY, float MouseWorldX, float MouseWorldY)
{
	unsigned MouseButtons = 0;
	if(Enabled())
	{
		if(Input()->KeyIsPressed(KEY_MOUSE_1)) MouseButtons |= 1;
		if(Input()->KeyIsPressed(KEY_MOUSE_2)) MouseButtons |= 2;
		if(Input()->KeyIsPressed(KEY_MOUSE_3)) MouseButtons |= 4;
	}

	m_MouseX = MouseX;
	m_MouseY = MouseY;
	m_MouseWorldX = MouseWorldX;
	m_MouseWorldY = MouseWorldY;
	m_LastMouseButtons = m_MouseButtons;
	m_MouseButtons = MouseButtons;
	m_pHotItem = m_pBecommingHotItem;
	if(m_pActiveItem)
		m_pHotItem = m_pActiveItem;
	m_pBecommingHotItem = 0;

	if(Enabled())
	{
		CLineInput *pActiveInput = CLineInput::GetActiveInput();
		if(pActiveInput && m_pLastActiveItem && pActiveInput != m_pLastActiveItem)
			pActiveInput->Deactivate();
	}
}